

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb-emu.c
# Opt level: O0

int sdl2_handle_input(Input *i)

{
  int iVar1;
  int local_50 [2];
  SDL_Event event;
  Input *i_local;
  
  event._48_8_ = i;
  do {
    while( true ) {
      while( true ) {
        iVar1 = SDL_PollEvent(local_50);
        if (iVar1 == 0) {
          return 0;
        }
        if (local_50[0] == 0x100) {
          *(undefined4 *)event._48_8_ = 0;
          return 1;
        }
        if (local_50[0] != 0x200) break;
        if (event.padding[4] == '\x0e') {
          *(undefined4 *)event._48_8_ = 0;
          return 1;
        }
      }
      if (local_50[0] == 0x300) break;
      if (local_50[0] == 0x301) {
        *(undefined4 *)event._48_8_ = 1;
        if (event.motion.which == 8) {
          *(undefined4 *)(event._48_8_ + 4) = 0x40;
          return 1;
        }
        if (event.motion.which == 0xd) {
          *(undefined4 *)(event._48_8_ + 4) = 0x80;
          return 1;
        }
        if (event.motion.which == 0x61) {
          *(undefined4 *)(event._48_8_ + 4) = 2;
          return 1;
        }
        if (event.motion.which == 100) {
          *(undefined4 *)(event._48_8_ + 4) = 1;
          return 1;
        }
        if (event.motion.which == 0x73) {
          *(undefined4 *)(event._48_8_ + 4) = 8;
          return 1;
        }
        if (event.motion.which == 0x77) {
          *(undefined4 *)(event._48_8_ + 4) = 4;
          return 1;
        }
        if (event.motion.which == 0x78) {
          *(undefined4 *)(event._48_8_ + 4) = 0x20;
          return 1;
        }
        if (event.motion.which == 0x7a) {
          *(undefined4 *)(event._48_8_ + 4) = 0x10;
          return 1;
        }
      }
    }
    *(undefined4 *)event._48_8_ = 2;
    if (event.motion.which == 8) {
      *(undefined4 *)(event._48_8_ + 4) = 0x40;
      return 1;
    }
    if (event.motion.which == 0xd) {
      *(undefined4 *)(event._48_8_ + 4) = 0x80;
      return 1;
    }
    if (event.motion.which == 0x61) {
      *(undefined4 *)(event._48_8_ + 4) = 2;
      return 1;
    }
    if (event.motion.which == 100) {
      *(undefined4 *)(event._48_8_ + 4) = 1;
      return 1;
    }
    if (event.motion.which == 0x73) {
      *(undefined4 *)(event._48_8_ + 4) = 8;
      return 1;
    }
    if (event.motion.which == 0x77) {
      *(undefined4 *)(event._48_8_ + 4) = 4;
      return 1;
    }
    if (event.motion.which == 0x78) {
      *(undefined4 *)(event._48_8_ + 4) = 0x20;
      return 1;
    }
  } while (event.motion.which != 0x7a);
  *(undefined4 *)(event._48_8_ + 4) = 0x10;
  return 1;
}

Assistant:

int
sdl2_handle_input(Input* i) {

    SDL_Event event;
    while (SDL_PollEvent(&event)) {
        switch (event.type) {
        
        case SDL_QUIT:
            i->type = Quit;
            return 1;
        
        case SDL_WINDOWEVENT:
            if(event.window.event == SDL_WINDOWEVENT_CLOSE) {
                i->type = Quit;
                return 1;
            }
            break;
        
        case SDL_KEYDOWN:
            i->type = KeyDown;
            switch(event.key.keysym.sym) {
                case SDLK_z:
                    i->button = Button_A;
                    return 1;
                case SDLK_x:
                    i->button = Button_B;
                    return 1;
                case SDLK_RETURN:
                    i->button = Button_Start;
                    return 1;
                case SDLK_BACKSPACE:
                    i->button = Button_Select;
                    return 1;
                case SDLK_w:
                    i->button = Button_Up;
                    return 1;
                case SDLK_s:
                    i->button = Button_Down;
                    return 1;
                case SDLK_d:
                    i->button = Button_Right;
                    return 1;
                case SDLK_a:
                    i->button = Button_Left;
                    return 1;
                default:
                    break;
            }
        break;

        case SDL_KEYUP:
            i->type = KeyUp;
            switch(event.key.keysym.sym) {
                case SDLK_z:
                    i->button = Button_A;
                    return 1;
                case SDLK_x:
                    i->button = Button_B;
                    return 1;
                case SDLK_RETURN:
                    i->button = Button_Start;
                    return 1;
                case SDLK_BACKSPACE:
                    i->button = Button_Select;
                    return 1;
                case SDLK_w:
                    i->button = Button_Up;
                    return 1;
                case SDLK_s:
                    i->button = Button_Down;
                    return 1;
                case SDLK_d:
                    i->button = Button_Right;
                    return 1;
                case SDLK_a:
                    i->button = Button_Left;
                    return 1;
                default:
                    break;
            }
        break;

        default:
            break;
        }
    }

    return 0;
}